

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLinearMipmapLinearSampleResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               LookupPrecision *prec,Vec2 *coord,int coordZ,Vec2 *fBounds,Vec4 *result)

{
  int c;
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  float fVar1;
  bool bVar2;
  bool bVar3;
  int c_00;
  int iVar4;
  TextureChannelClass TVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int y0;
  int y1;
  int iVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float local_1d4;
  Vec2 vBounds0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  Vec2 local_140;
  Vec2 local_138;
  Vec2 local_130;
  Vec2 local_128;
  Vec2 vBounds1;
  ColorQuad quad0;
  ColorQuad quad1;
  
  dim = (level0->m_size).m_data[0];
  dim_00 = (level0->m_size).m_data[1];
  dim_01 = (level1->m_size).m_data[0];
  dim_02 = (level1->m_size).m_data[1];
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds0,sampler->normalizedCoords,dim,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,sampler->normalizedCoords,dim_01,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds0,sampler->normalizedCoords,dim_00,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds1,sampler->normalizedCoords,dim_02,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar12 = floorf(uBounds0.m_data[0] + -0.5);
  fVar13 = floorf(uBounds0.m_data[1] + -0.5);
  fVar14 = floorf(uBounds1.m_data[0] + -0.5);
  fVar15 = floorf(uBounds1.m_data[1] + -0.5);
  fVar16 = floorf(vBounds0.m_data[0] + -0.5);
  c_00 = (int)fVar16;
  fVar16 = floorf(vBounds0.m_data[1] + -0.5);
  iVar4 = (int)fVar16;
  fVar16 = floorf(vBounds1.m_data[0] + -0.5);
  fVar17 = floorf(vBounds1.m_data[1] + -0.5);
  TVar5 = getTextureChannelClass((level0->m_format).type);
  if (TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
    local_1d4 = computeBilinearSearchStepForSnorm(prec);
  }
  else {
    local_1d4 = 0.0;
    if (TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      local_1d4 = computeBilinearSearchStepForUnorm(prec);
    }
  }
  bVar3 = c_00 <= iVar4;
  if (c_00 <= iVar4) {
    iVar10 = (int)fVar17;
    do {
      if ((int)fVar12 <= (int)fVar13) {
        iVar11 = (int)fVar12;
        do {
          quad0.p11.m_data[0] = 0.0;
          quad0.p11.m_data[1] = 0.0;
          quad0.p11.m_data[2] = 0.0;
          quad0.p11.m_data[3] = 0.0;
          quad0.p10.m_data[0] = 0.0;
          quad0.p10.m_data[1] = 0.0;
          quad0.p10.m_data[2] = 0.0;
          quad0.p10.m_data[3] = 0.0;
          quad0.p01.m_data[0] = 0.0;
          quad0.p01.m_data[1] = 0.0;
          quad0.p01.m_data[2] = 0.0;
          quad0.p01.m_data[3] = 0.0;
          quad0.p00.m_data[0] = 0.0;
          quad0.p00.m_data[1] = 0.0;
          quad0.p00.m_data[2] = 0.0;
          quad0.p00.m_data[3] = 0.0;
          iVar6 = TexVerifierUtil::wrap(sampler->wrapS,iVar11,dim);
          c = iVar11 + 1;
          iVar7 = TexVerifierUtil::wrap(sampler->wrapS,c,dim);
          iVar8 = TexVerifierUtil::wrap(sampler->wrapT,c_00,dim_00);
          iVar9 = TexVerifierUtil::wrap(sampler->wrapT,c_00 + 1,dim_00);
          lookupQuad(&quad0,level0,sampler,iVar6,iVar7,iVar8,iVar9,coordZ);
          fVar17 = local_1d4;
          if (TVar5 == TEXTURECHANNELCLASS_FLOATING_POINT) {
            fVar17 = computeBilinearSearchStepFromFloatQuad(prec,&quad0);
          }
          if ((int)fVar16 <= iVar10) {
            fVar24 = (uBounds0.m_data[0] + -0.5) - (float)iVar11;
            fVar1 = 1.0;
            if (fVar24 <= 1.0) {
              fVar1 = fVar24;
            }
            fVar22 = (uBounds0.m_data[1] + -0.5) - (float)iVar11;
            fVar18 = 1.0;
            if (fVar22 <= 1.0) {
              fVar18 = fVar22;
            }
            fVar25 = (vBounds0.m_data[0] + -0.5) - (float)c_00;
            fVar19 = 1.0;
            if (fVar25 <= 1.0) {
              fVar19 = fVar25;
            }
            fVar26 = (vBounds0.m_data[1] + -0.5) - (float)c_00;
            fVar20 = 1.0;
            if (fVar26 <= 1.0) {
              fVar20 = fVar26;
            }
            iVar11 = (int)fVar16;
            do {
              iVar7 = iVar11 + 1;
              iVar6 = (int)fVar14;
              while (iVar6 <= (int)fVar15) {
                quad1.p11.m_data[0] = 0.0;
                quad1.p11.m_data[1] = 0.0;
                quad1.p11.m_data[2] = 0.0;
                quad1.p11.m_data[3] = 0.0;
                quad1.p10.m_data[0] = 0.0;
                quad1.p10.m_data[1] = 0.0;
                quad1.p10.m_data[2] = 0.0;
                quad1.p10.m_data[3] = 0.0;
                quad1.p01.m_data[0] = 0.0;
                quad1.p01.m_data[1] = 0.0;
                quad1.p01.m_data[2] = 0.0;
                quad1.p01.m_data[3] = 0.0;
                quad1.p00.m_data[0] = 0.0;
                quad1.p00.m_data[1] = 0.0;
                quad1.p00.m_data[2] = 0.0;
                quad1.p00.m_data[3] = 0.0;
                iVar8 = TexVerifierUtil::wrap(sampler->wrapS,iVar6,dim_01);
                iVar9 = TexVerifierUtil::wrap(sampler->wrapS,iVar6 + 1,dim_01);
                y0 = TexVerifierUtil::wrap(sampler->wrapT,iVar11,dim_02);
                y1 = TexVerifierUtil::wrap(sampler->wrapT,iVar7,dim_02);
                lookupQuad(&quad1,level1,sampler,iVar8,iVar9,y0,y1,coordZ);
                fVar21 = local_1d4;
                if (TVar5 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                  fVar21 = computeBilinearSearchStepFromFloatQuad(prec,&quad1);
                }
                fVar23 = (uBounds1.m_data[0] + -0.5) - (float)iVar6;
                local_138.m_data[0] = 1.0;
                if (fVar23 <= 1.0) {
                  local_138.m_data[0] = fVar23;
                }
                local_138.m_data[0] = (float)(~-(uint)(fVar23 < 0.0) & (uint)local_138.m_data[0]);
                fVar23 = (uBounds1.m_data[1] + -0.5) - (float)iVar6;
                local_138.m_data[1] = 1.0;
                if (fVar23 <= 1.0) {
                  local_138.m_data[1] = fVar23;
                }
                local_138.m_data[1] = (float)(~-(uint)(fVar23 < 0.0) & (uint)local_138.m_data[1]);
                fVar23 = (vBounds1.m_data[0] + -0.5) - (float)iVar11;
                local_140.m_data[0] = 1.0;
                if (fVar23 <= 1.0) {
                  local_140.m_data[0] = fVar23;
                }
                local_140.m_data[0] = (float)(~-(uint)(fVar23 < 0.0) & (uint)local_140.m_data[0]);
                fVar23 = (vBounds1.m_data[1] + -0.5) - (float)iVar11;
                local_140.m_data[1] = 1.0;
                if (fVar23 <= 1.0) {
                  local_140.m_data[1] = fVar23;
                }
                local_140.m_data[1] = (float)(~-(uint)(fVar23 < 0.0) & (uint)local_140.m_data[1]);
                local_130.m_data[0] = (float)(~-(uint)(fVar25 < 0.0) & (uint)fVar19);
                local_130.m_data[1] = (float)(~-(uint)(fVar26 < 0.0) & (uint)fVar20);
                local_128.m_data[0] = (float)(~-(uint)(fVar24 < 0.0) & (uint)fVar1);
                local_128.m_data[1] = (float)(~-(uint)(fVar22 < 0.0) & (uint)fVar18);
                bVar2 = is2DTrilinearFilterResultValid
                                  (prec,&quad0,&quad1,&local_128,&local_130,&local_138,&local_140,
                                   fBounds,(float)(~-(uint)(fVar17 <= fVar21) & (uint)fVar21 |
                                                  -(uint)(fVar17 <= fVar21) & (uint)fVar17),result);
                iVar6 = iVar6 + 1;
                if (bVar2) {
                  if (iVar11 <= iVar10) {
                    return bVar3;
                  }
                  goto LAB_00acaf5d;
                }
              }
              iVar11 = iVar7;
            } while (iVar7 <= iVar10);
          }
LAB_00acaf5d:
          iVar11 = c;
        } while (c <= (int)fVar13);
      }
      c_00 = c_00 + 1;
      bVar3 = c_00 <= iVar4;
    } while (c_00 <= iVar4);
  }
  return bVar3;
}

Assistant:

static bool isLinearMipmapLinearSampleResultValid (const ConstPixelBufferAccess&	level0,
												   const ConstPixelBufferAccess&	level1,
												   const Sampler&					sampler,
												   const LookupPrecision&			prec,
												   const Vec2&						coord,
												   const int						coordZ,
												   const Vec2&						fBounds,
												   const Vec4&						result)
{
	// \todo [2013-07-04 pyry] This is strictly not correct as coordinates between levels should be dependent.
	//						   Right now this allows pairing any two valid bilinear quads.

	const int					w0				= level0.getWidth();
	const int					w1				= level1.getWidth();
	const int					h0				= level0.getHeight();
	const int					h1				= level1.getHeight();

	const Vec2					uBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					uBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					vBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2					vBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int					minI0			= deFloorFloatToInt32(uBounds0.x()-0.5f);
	const int					maxI0			= deFloorFloatToInt32(uBounds0.y()-0.5f);
	const int					minI1			= deFloorFloatToInt32(uBounds1.x()-0.5f);
	const int					maxI1			= deFloorFloatToInt32(uBounds1.y()-0.5f);
	const int					minJ0			= deFloorFloatToInt32(vBounds0.x()-0.5f);
	const int					maxJ0			= deFloorFloatToInt32(vBounds0.y()-0.5f);
	const int					minJ1			= deFloorFloatToInt32(vBounds1.x()-0.5f);
	const int					maxJ1			= deFloorFloatToInt32(vBounds1.y()-0.5f);

	const TextureChannelClass	texClass		= getTextureChannelClass(level0.getFormat().type);
	const float					cSearchStep		= texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	? computeBilinearSearchStepForUnorm(prec) :
												  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	? computeBilinearSearchStepForSnorm(prec) :
												  0.0f; // Step is computed for floating-point quads based on texel values.

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			ColorQuad	quad0;
			float		searchStep0;

			{
				const int	x0		= wrap(sampler.wrapS, i0  , w0);
				const int	x1		= wrap(sampler.wrapS, i0+1, w0);
				const int	y0		= wrap(sampler.wrapT, j0  , h0);
				const int	y1		= wrap(sampler.wrapT, j0+1, h0);
				lookupQuad(quad0, level0, sampler, x0, x1, y0, y1, coordZ);

				if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
					searchStep0 = computeBilinearSearchStepFromFloatQuad(prec, quad0);
				else
					searchStep0 = cSearchStep;
			}

			const float	minA0	= de::clamp((uBounds0.x()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	maxA0	= de::clamp((uBounds0.y()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	minB0	= de::clamp((vBounds0.x()-0.5f)-float(j0), 0.0f, 1.0f);
			const float	maxB0	= de::clamp((vBounds0.y()-0.5f)-float(j0), 0.0f, 1.0f);

			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					ColorQuad	quad1;
					float		searchStep1;

					{
						const int	x0		= wrap(sampler.wrapS, i1  , w1);
						const int	x1		= wrap(sampler.wrapS, i1+1, w1);
						const int	y0		= wrap(sampler.wrapT, j1  , h1);
						const int	y1		= wrap(sampler.wrapT, j1+1, h1);
						lookupQuad(quad1, level1, sampler, x0, x1, y0, y1, coordZ);

						if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
							searchStep1 = computeBilinearSearchStepFromFloatQuad(prec, quad1);
						else
							searchStep1 = cSearchStep;
					}

					const float	minA1	= de::clamp((uBounds1.x()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	maxA1	= de::clamp((uBounds1.y()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	minB1	= de::clamp((vBounds1.x()-0.5f)-float(j1), 0.0f, 1.0f);
					const float	maxB1	= de::clamp((vBounds1.y()-0.5f)-float(j1), 0.0f, 1.0f);

					if (is2DTrilinearFilterResultValid(prec, quad0, quad1, Vec2(minA0, maxA0), Vec2(minB0, maxB0), Vec2(minA1, maxA1), Vec2(minB1, maxB1),
													   fBounds, de::min(searchStep0, searchStep1), result))
						return true;
				}
			}
		}
	}

	return false;
}